

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Translator *
helics::generateTranslator
          (Federate *fed,bool global,string_view name,TranslatorTypes ttype,string_view endpointType
          ,string_view units)

{
  string_view endpointType_00;
  string_view translatorName;
  string_view translatorName_00;
  string_view units_00;
  string_view units_01;
  string_view endpointType_01;
  char *in_RCX;
  size_t in_RDX;
  byte in_SIL;
  int in_R8D;
  char *in_stack_00000008;
  char *in_stack_00000010;
  undefined8 in_stack_00000018;
  Federate *in_stack_00000020;
  Translator *trans;
  undefined8 local_a0;
  Federate *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  if ((in_SIL & 1) == 0) {
    endpointType_01._M_str = in_stack_00000010;
    endpointType_01._M_len = (size_t)in_stack_00000008;
    translatorName_00._M_str = in_RCX;
    translatorName_00._M_len = in_RDX;
    units_01._M_str = in_stack_ffffffffffffffb8;
    units_01._M_len = in_stack_ffffffffffffffb0;
    local_a0 = Federate::registerTranslator
                         (in_stack_00000020,translatorName_00,endpointType_01,units_01);
  }
  else {
    translatorName._M_str = in_stack_ffffffffffffffa0;
    translatorName._M_len = in_stack_ffffffffffffff98;
    endpointType_00._M_str = in_stack_ffffffffffffff90;
    endpointType_00._M_len = in_stack_ffffffffffffff88;
    units_00._M_str = in_stack_00000008;
    units_00._M_len = (size_t)in_stack_00000020;
    local_a0 = Federate::registerGlobalTranslator
                         (in_stack_ffffffffffffff80,translatorName,endpointType_00,units_00);
  }
  if (in_R8D != 0) {
    Translator::setTranslatorType
              ((Translator *)in_stack_00000020,(int32_t)((ulong)in_stack_00000018 >> 0x20));
  }
  return local_a0;
}

Assistant:

static Translator& generateTranslator(Federate* fed,
                                      bool global,
                                      std::string_view name,
                                      TranslatorTypes ttype,
                                      std::string_view endpointType,
                                      std::string_view units)
{
    Translator& trans = (global) ? fed->registerGlobalTranslator(name, endpointType, units) :
                                   fed->registerTranslator(name, endpointType, units);
    if (ttype != TranslatorTypes::CUSTOM) {
        trans.setTranslatorType(static_cast<std::int32_t>(ttype));
    }
    return trans;
}